

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void nco_set(int n,double *x,double *w)

{
  ostream *poVar1;
  int local_2c;
  int i;
  double d;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n == 1) {
    *w = 2.0;
  }
  else if (n == 2) {
    *w = 1.0;
    w[1] = 1.0;
  }
  else if (n == 3) {
    *w = 1.3333333333333333;
    w[1] = -0.6666666666666666;
    w[2] = 1.3333333333333333;
  }
  else if (n == 4) {
    *w = 0.9166666666666666;
    w[1] = 0.08333333333333333;
    w[2] = 0.08333333333333333;
    w[3] = 0.9166666666666666;
  }
  else if (n == 5) {
    *w = 1.1;
    w[1] = -1.4;
    w[2] = 2.6;
    w[3] = -1.4;
    w[4] = 1.1;
  }
  else if (n == 6) {
    *w = 0.8486111111111111;
    w[1] = -0.6291666666666667;
    w[2] = 0.7805555555555556;
    w[3] = 0.7805555555555556;
    w[4] = -0.6291666666666667;
    w[5] = 0.8486111111111111;
  }
  else if (n == 7) {
    *w = 0.9735449735449735;
    w[1] = -2.019047619047619;
    w[2] = 4.647619047619048;
    w[3] = -5.204232804232804;
    w[4] = 4.647619047619048;
    w[5] = -2.019047619047619;
    w[6] = 0.9735449735449735;
  }
  else if (n == 8) {
    *w = 0.7977678571428571;
    w[1] = -1.2513392857142858;
    w[2] = 2.2174107142857142;
    w[3] = -0.7638392857142857;
    w[4] = -0.7638392857142857;
    w[5] = 2.2174107142857142;
    w[6] = -1.2513392857142858;
    w[7] = 0.7977678571428571;
  }
  else if (n == 9) {
    *w = 0.8917548500881834;
    w[1] = -2.5771604938271606;
    w[2] = 7.350088183421517;
    w[3] = -12.140652557319225;
    w[4] = 14.951940035273369;
    w[5] = -12.140652557319225;
    w[6] = 7.350088183421517;
    w[7] = -2.5771604938271606;
    w[8] = 0.8917548500881834;
  }
  else {
    if (n != 10) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"NCO_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 10.\n");
      exit(1);
    }
    *w = 0.758508873456792;
    w[1] = -1.819664627425049;
    w[2] = 4.319301146384676;
    w[3] = -4.708337742504753;
    w[4] = 2.450192350088813;
    w[5] = 2.450192350087711;
    w[6] = -4.708337742504625;
    w[7] = 4.319301146384526;
    w[8] = -1.819664627425028;
    w[9] = 0.75850887345679;
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    x[local_2c] = (double)((local_2c * 2 - n) + 1) / (double)(n + 1);
  }
  return;
}

Assistant:

void nco_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NCO_SET sets abscissas and weights for open Newton-Cotes quadrature.
//
//  Discussion:
//
//    The open Newton-Cotes rules use equally spaced abscissas, and
//    hence may be used with equally spaced data.
//
//    The rules are called "open" because they do not include the interval
//    endpoints.
//
//    Most of the rules involve negative weights.  These can produce loss
//    of accuracy due to the subtraction of large, nearly equal quantities.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 June 2015
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Wolfram Media / Cambridge University Press, 1999.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be between 1 and 10.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double d;
  int i;

  if ( n == 1 )
  {
    w[0] = 2.0;
  }
  else if ( n == 2 )
  {
    w[0] = 1.0;
    w[1] = 1.0;
  }
  else if ( n == 3 )
  {
    d = 3.0;

    w[0] =   4.0 / d;
    w[1] = - 2.0 / d;
    w[2] =   4.0 / d;
  }
  else if ( n == 4 )
  {
    d = 12.0;

    w[0] = 11.0 / d;
    w[1] =  1.0 / d;
    w[2] =  1.0 / d;
    w[3] = 11.0 / d;
  }
  else if ( n == 5 )
  {
    d = 10.0;

    w[0] =   11.0 / d;
    w[1] = - 14.0 / d;
    w[2] =   26.0 / d;
    w[3] = - 14.0 / d;
    w[4] =   11.0 / d;
  }
  else if ( n == 6 )
  {
    d = 1440.0;

    w[0] =  1222.0 / d;
    w[1] = - 906.0 / d;
    w[2] =  1124.0 / d;
    w[3] =  1124.0 / d;
    w[4] = - 906.0 / d;
    w[5] =  1222.0 / d;
  }
  else if ( n == 7 )
  {
    d = 945.0;

    w[0] =    920.0 / d;
    w[1] = - 1908.0 / d;
    w[2] =   4392.0 / d;
    w[3] = - 4918.0 / d;
    w[4] =   4392.0 / d;
    w[5] = - 1908.0 / d;
    w[6] =    920.0 / d;
  }
  else if ( n == 8 )
  {
    d = 40320.0;

    w[0] =   32166.0 / d;
    w[1] = - 50454.0 / d;
    w[2] =   89406.0 / d;
    w[3] = - 30798.0 / d;
    w[4] = - 30798.0 / d;
    w[5] =   89406.0 / d;
    w[6] = - 50454.0 / d;
    w[7] =   32166.0 / d;
  }
  else if ( n == 9 )
  {
    d = 4536.0;

    w[0] =    4045.0 / d;
    w[1] = - 11690.0 / d;
    w[2] =   33340.0 / d;
    w[3] = - 55070.0 / d;
    w[4] =   67822.0 / d;
    w[5] = - 55070.0 / d;
    w[6] =   33340.0 / d;
    w[7] = - 11690.0 / d;
    w[8] =    4045.0 / d;
  }
  else if ( n == 10 )
  {
    w[0] =    0.758508873456792;
    w[1] =   -1.819664627425049;
    w[2] =    4.319301146384676;
    w[3] =   -4.708337742504753;
    w[4] =    2.450192350088813;
    w[5] =    2.450192350087711;
    w[6] =   -4.708337742504625;
    w[7] =    4.319301146384526;
    w[8] =   -1.819664627425028;
    w[9] =    0.758508873456790;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "NCO_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 to 10.\n";
    exit ( 1 );
  }
//
//  Set the abscissas.
//
  for ( i = 0; i < n; i++ )
  {
    x[i] = double( 2 * i - n + 1 ) 
         / double( n + 1 );
  }

  return;
}